

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O3

void arrangeQuoters_superFast_iVar5
               (uint *pInOut,uint *temp,int start,int iQ,int jQ,int kQ,int lQ,char *pCanonPerm,
               uint *pCanonPhase)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  if (jQ != 1 || iQ != 0) {
    lVar6 = (long)start;
    if (1 < start) {
      uVar4 = (ulong)(start - 1);
      lVar7 = 0;
      do {
        temp[lVar6 + lVar7 + -1] = pInOut[(uVar4 + lVar7) - (long)iQ];
        temp[lVar6 + lVar7 + -2] = pInOut[(uVar4 + lVar7) - (long)jQ];
        temp[lVar6 + lVar7 + -3] = pInOut[(uVar4 + lVar7) - (long)kQ];
        temp[lVar6 + lVar7 + -4] = pInOut[(uVar4 + lVar7) - (long)lQ];
        uVar1 = uVar4 + lVar7;
        lVar7 = lVar7 + -4;
      } while (4 < uVar1);
    }
    memcpy(pInOut,temp,lVar6 << 2);
    iVar2 = iQ - jQ;
    iVar5 = -iVar2;
    if (0 < iVar2) {
      iVar5 = iVar2;
    }
    uVar3 = adjustInfoAfterSwap(pCanonPerm,*pCanonPhase,5,(iQ + iVar5 * 4) - 4);
    *pCanonPhase = uVar3;
  }
  return;
}

Assistant:

void arrangeQuoters_superFast_iVar5(unsigned* pInOut, unsigned* temp, int start,  int iQ, int jQ, int kQ, int lQ, char * pCanonPerm, unsigned* pCanonPhase)
{
    int i,blockSize,shiftSize;
    unsigned* tempPtr = temp+start;
//     printf("in arrangeQuoters_superFast_iVar5\n");

    if(iQ == 0 && jQ == 1)
        return; 
    blockSize = sizeof(unsigned);
    shiftSize = 4;
    for(i=start-1;i>0;i-=shiftSize)
    {       
        tempPtr -= 1;       
        memcpy(tempPtr, pInOut+i-iQ, blockSize);
        tempPtr -= 1;
        memcpy(tempPtr, pInOut+i-jQ, blockSize);
        tempPtr -= 1;
        memcpy(tempPtr, pInOut+i-kQ, blockSize);
        tempPtr -= 1;
        memcpy(tempPtr, pInOut+i-lQ, blockSize);        
    }   
    memcpy(pInOut, temp, start*sizeof(unsigned));
    updataInfo(iQ, jQ, 5, pCanonPerm, pCanonPhase);
}